

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

bool __thiscall
google::protobuf::ServiceDescriptorProto::MergePartialFromCodedStream
          (ServiceDescriptorProto *this,CodedInputStream *input)

{
  ArenaStringPtr *this_00;
  byte bVar1;
  byte *pbVar2;
  void *pvVar3;
  uint8 *puVar4;
  bool bVar5;
  uint32 uVar6;
  uint uVar7;
  int iVar8;
  Type *this_01;
  ServiceOptions *this_02;
  pair<int,_int> pVar9;
  UnknownFieldSet *unknown_fields;
  char cVar10;
  uint tag;
  ulong uVar11;
  string *value;
  
  this_00 = &this->name_;
LAB_002feb7e:
  pbVar2 = input->buffer_;
  uVar6 = 0;
  if (pbVar2 < input->buffer_end_) {
    bVar1 = *pbVar2;
    uVar6 = (uint32)bVar1;
    if ((char)bVar1 < '\x01') goto LAB_002feba1;
    input->buffer_ = pbVar2 + 1;
    uVar11 = (ulong)bVar1 | 0x100000000;
  }
  else {
LAB_002feba1:
    uVar6 = io::CodedInputStream::ReadTagFallback(input,uVar6);
    uVar11 = 0;
    if (uVar6 - 1 < 0x7f) {
      uVar11 = 0x100000000;
    }
    uVar11 = uVar6 | uVar11;
  }
  tag = (uint)uVar11;
  if ((uVar11 & 0x100000000) != 0) {
    uVar7 = (uint)(uVar11 >> 3) & 0x1fffffff;
    cVar10 = (char)uVar11;
    if (uVar7 == 3) {
      if (cVar10 != '\x1a') goto LAB_002febc2;
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
      this_02 = this->options_;
      if (this_02 == (ServiceOptions *)0x0) {
        this_02 = (ServiceOptions *)operator_new(0x70);
        ServiceOptions::ServiceOptions(this_02);
        this->options_ = this_02;
      }
      puVar4 = input->buffer_;
      if ((puVar4 < input->buffer_end_) && (iVar8 = (int)(char)*puVar4, -1 < iVar8)) {
        input->buffer_ = puVar4 + 1;
      }
      else {
        iVar8 = io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        if (iVar8 < 0) {
          return false;
        }
      }
      pVar9 = io::CodedInputStream::IncrementRecursionDepthAndPushLimit(input,iVar8);
      if ((long)pVar9 < 0) {
        return false;
      }
      bVar5 = ServiceOptions::MergePartialFromCodedStream(this_02,input);
LAB_002fed44:
      if (bVar5 == false) {
        return false;
      }
      bVar5 = io::CodedInputStream::DecrementRecursionDepthAndPopLimit(input,pVar9.first);
      goto LAB_002febf5;
    }
    if (uVar7 == 2) {
      if (cVar10 == '\x12') {
        this_01 = internal::RepeatedPtrFieldBase::
                  Add<google::protobuf::RepeatedPtrField<google::protobuf::MethodDescriptorProto>::TypeHandler>
                            (&(this->method_).super_RepeatedPtrFieldBase,(Type *)0x0);
        puVar4 = input->buffer_;
        if ((puVar4 < input->buffer_end_) && (iVar8 = (int)(char)*puVar4, -1 < iVar8)) {
          input->buffer_ = puVar4 + 1;
        }
        else {
          iVar8 = io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
          if (iVar8 < 0) {
            return false;
          }
        }
        pVar9 = io::CodedInputStream::IncrementRecursionDepthAndPushLimit(input,iVar8);
        if ((long)pVar9 < 0) {
          return false;
        }
        bVar5 = MethodDescriptorProto::MergePartialFromCodedStream(this_01,input);
        goto LAB_002fed44;
      }
      goto LAB_002febc2;
    }
    if ((uVar7 == 1) && (cVar10 == '\n')) {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
      value = (this->name_).ptr_;
      if (value == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
        internal::ArenaStringPtr::CreateInstanceNoArena
                  (this_00,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
        value = this_00->ptr_;
      }
      bVar5 = internal::WireFormatLite::ReadBytes(input,value);
      if (!bVar5) {
        return false;
      }
      internal::WireFormatLite::VerifyUtf8String
                ((this_00->ptr_->_M_dataplus)._M_p,(int)this_00->ptr_->_M_string_length,PARSE,
                 "google.protobuf.ServiceDescriptorProto.name");
      goto LAB_002feb7e;
    }
  }
LAB_002febc2:
  if (tag == 0) {
    return true;
  }
  if ((tag & 7) == 4) {
    return true;
  }
  pvVar3 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar3 & 1) == 0) {
    unknown_fields =
         internal::
         InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
         ::mutable_unknown_fields_slow
                   (&(this->_internal_metadata_).
                     super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                   );
  }
  else {
    unknown_fields = (UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe);
  }
  bVar5 = internal::WireFormat::SkipField(input,tag,unknown_fields);
LAB_002febf5:
  if (bVar5 == false) {
    return false;
  }
  goto LAB_002feb7e;
}

Assistant:

bool ServiceDescriptorProto::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:google.protobuf.ServiceDescriptorProto)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional string name = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_name()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->name().data(), this->name().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "google.protobuf.ServiceDescriptorProto.name");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .google.protobuf.MethodDescriptorProto method = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(18u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_method()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .google.protobuf.ServiceOptions options = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(26u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_options()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:google.protobuf.ServiceDescriptorProto)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:google.protobuf.ServiceDescriptorProto)
  return false;
#undef DO_
}